

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocale::toString(QString *__return_storage_ptr__,QLocale *this,QDateTime *dateTime,
                 FormatType format)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  QSystemLocale *pQVar4;
  long in_FS_OFFSET;
  QStringView format_00;
  QVariant QStack_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QDateTime::isValid(dateTime);
  if (!bVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_00312c81;
  }
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = systemLocale();
    ::QVariant::QVariant(&QStack_78,dateTime);
    (*pQVar4->_vptr_QSystemLocale[2])
              (&local_58,pQVar4,(ulong)(0x18 - (format == LongFormat)),&QStack_78);
    ::QVariant::~QVariant(&QStack_78);
    bVar3 = ::QVariant::isNull((QVariant *)&local_58);
    if (bVar3) {
      ::QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_00312b88;
    }
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (bVar3) goto LAB_00312b88;
  }
  else {
LAB_00312b88:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    dateTimeFormat((QString *)&local_58,this,format);
    uVar2 = local_58._16_8_;
    uVar1 = local_58._8_8_;
    QCalendar::QCalendar((QCalendar *)&QStack_78);
    format_00.m_data = (storage_type_conflict *)uVar1;
    format_00.m_size = uVar2;
    QCalendar::dateTimeToString
              (__return_storage_ptr__,(QCalendar *)&QStack_78,format_00,dateTime,
               (QDate)0x8000000000000000,(QTime)0xffffffff,this);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00312c81:
  __stack_chk_fail();
}

Assistant:

QString QLocale::toString(const QDateTime &dateTime, FormatType format) const
{
    if (!dateTime.isValid())
        return QString();

#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::DateTimeToStringLong
                                             : QSystemLocale::DateTimeToStringShort,
                                             dateTime);
        if (!res.isNull())
            return res.toString();
    }
#endif

    const QString format_str = dateTimeFormat(format);
    return toString(dateTime, format_str);
}